

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.cc
# Opt level: O1

void google::protobuf::internal::InitImplicitWeakMessageDefaultInstance(void)

{
  _DAT_003d2c08 = 0;
  implicit_weak_message_default_instance = &PTR__ImplicitWeakMessage_003c3cd8;
  DAT_003d2c10 = &DAT_003d2c20;
  DAT_003d2c18 = 0;
  DAT_003d2c20 = 0;
  return;
}

Assistant:

void InitImplicitWeakMessageDefaultInstance() {
  implicit_weak_message_default_instance.DefaultConstruct();
}